

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

ITexture * __thiscall
irr::video::CNullDriver::loadTextureFromFile(CNullDriver *this,IReadFile *file,path *hashName)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ITexture *pIVar4;
  long *plVar5;
  double __x;
  undefined4 extraout_var_01;
  
  iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x46])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar5 == (long *)0x0) {
    pIVar4 = (ITexture *)0x0;
  }
  else {
    if ((int)(hashName->str)._M_string_length == 0) {
      iVar3 = (*file->_vptr_IReadFile[4])(file);
      hashName = (path *)CONCAT44(extraout_var_00,iVar3);
    }
    iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x75])(this,hashName,plVar5);
    pIVar4 = (ITexture *)CONCAT44(extraout_var_01,iVar3);
    if (pIVar4 == (ITexture *)0x0) {
      pIVar4 = (ITexture *)0x0;
    }
    else {
      (*file->_vptr_IReadFile[4])(file);
      os::Printer::log(__x);
    }
    lVar2 = *(long *)(*plVar5 + -0x18);
    piVar1 = (int *)((long)plVar5 + lVar2 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      plVar5 = (long *)((long)plVar5 + lVar2);
      (**(code **)(*plVar5 + 8))(plVar5);
    }
  }
  return pIVar4;
}

Assistant:

video::ITexture *CNullDriver::loadTextureFromFile(io::IReadFile *file, const io::path &hashName)
{
	ITexture *texture = nullptr;

	IImage *image = createImageFromFile(file);
	if (!image)
		return nullptr;

	if (checkImage(image)) {
		texture = createDeviceDependentTexture(hashName.size() ? hashName : file->getFileName(), image);
		if (texture)
			os::Printer::log("Loaded texture", file->getFileName(), ELL_DEBUG);
	}

	image->drop();

	return texture;
}